

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O1

void __thiscall
ft::map<int,int,ft::less<int>,ft::allocator<ft::pair<int_const,int>>>::
insert<ft::constTreeIterator<ft::pair<int_const,int>,ft::allocator<ft::treeNode<ft::pair<int_const,int>>>>>
          (map<int,int,ft::less<int>,ft::allocator<ft::pair<int_const,int>>> *this,
          constTreeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
          *first,constTreeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
                 *last,type *param_3)

{
  treeNode<ft::pair<const_int,_int>_> *ptVar1;
  treeNode<ft::pair<const_int,_int>_> *ptVar2;
  treeNode<ft::pair<const_int,_int>_> *val;
  treeNode<ft::pair<const_int,_int>_> *ptVar3;
  bool bVar4;
  pair<ft::treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>,_bool>
  local_48;
  
  val = (first->
        super_treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
        ).m_node;
  if (val != (last->
             super_treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
             ).m_node) {
    do {
      map<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>::insert
                (&local_48,
                 (map<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *)this,
                 &val->value);
      ptVar3 = (first->
               super_treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
               ).m_node;
      ptVar1 = ptVar3->right;
      ptVar2 = ((first->
                super_treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
                ).m_tree)->NIL;
      if (ptVar1 == ptVar2) {
        do {
          val = ptVar3->parent;
          bVar4 = val->right == ptVar3;
          ptVar3 = val;
        } while (bVar4);
      }
      else {
        (first->
        super_treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
        ).m_node = ptVar1;
        do {
          val = ptVar1;
          ptVar1 = val->left;
        } while (val->left != ptVar2);
      }
      (first->
      super_treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
      ).m_node = val;
    } while (val != (last->
                    super_treeIterator<ft::pair<const_int,_int>,_ft::allocator<ft::treeNode<ft::pair<const_int,_int>_>_>_>
                    ).m_node);
  }
  return;
}

Assistant:

void	insert(Iterator first, Iterator last,
			 		typename ft::_void_t<typename ft::iterator_traits<Iterator>::iterator_category>::type * = 0)
	{
		while (first != last)
		{
			this->insert(*first);
			++first;
		}
	}